

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

void Assimp::IFC::FindLikelyCrossingLines(iterator current)

{
  pointer paVar1;
  pointer paVar2;
  pointer paVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  reference rVar9;
  
  paVar2 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar3 = ((current._M_current)->contour).
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar6 = 0.0;
  dVar7 = 0.0;
  for (lVar4 = 0; paVar1 = (pointer)((long)&paVar2->x + lVar4), paVar1 != paVar3;
      lVar4 = lVar4 + 0x10) {
    dVar5 = paVar1->x;
    if (lVar4 != 0) {
      dVar7 = ABS(dVar5 - dVar7);
      dVar8 = ABS(*(double *)((long)&paVar2->y + lVar4) - dVar6);
      dVar6 = dVar8;
      if (dVar8 <= dVar7) {
        dVar6 = dVar7;
      }
      if (ABS(dVar7 - dVar8) < dVar6 * 0.8) {
        rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&(current._M_current)->skiplist,(lVar4 >> 4) - 1);
        *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
        dVar5 = paVar1->x;
      }
    }
    dVar6 = *(double *)((long)&paVar2->y + lVar4);
    dVar7 = dVar5;
  }
  dVar7 = ABS(paVar2->x - dVar7);
  dVar5 = ABS(paVar2->y - dVar6);
  dVar6 = dVar5;
  if (dVar5 <= dVar7) {
    dVar6 = dVar7;
  }
  if (ABS(dVar7 - dVar5) < dVar6 * 0.8) {
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&(current._M_current)->skiplist,
                       ((ulong)((current._M_current)->skiplist).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                       + ((long)((current._M_current)->skiplist).
                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)((current._M_current)->skiplist).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8)
                       - 1);
    *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
  }
  return;
}

Assistant:

void FindLikelyCrossingLines(ContourVector::iterator current)
{
    SkipList& skiplist = (*current).skiplist;
    IfcVector2 last_proj_point;

    const Contour::const_iterator cbegin = (*current).contour.begin(), cend = (*current).contour.end();
    for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {
        const IfcVector2& proj_point = *cit;

        if (cit != cbegin) {
            IfcVector2 vdelta = proj_point - last_proj_point;
            if (LikelyDiagonal(vdelta)) {
                skiplist[std::distance(cbegin, cit) - 1] = true;
            }
        }

        last_proj_point = proj_point;
    }

    // handle last segment
    if (LikelyDiagonal(*cbegin - last_proj_point)) {
        skiplist[skiplist.size()-1] = true;
    }
}